

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  long index;
  bool bVar1;
  int iVar2;
  GGMTree *this;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  size_type __n;
  reference plVar3;
  reference pGVar4;
  insert_iterator<std::vector<long,_std::allocator<long>_>_> iVar5;
  GGMNode *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<GGMNode,_std::allocator<GGMNode>_> *__range1_1;
  undefined1 local_140 [8];
  vector<GGMNode,_std::allocator<GGMNode>_> remain_node;
  long pos_1;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  vector<GGMNode,_std::allocator<GGMNode>_> node_list;
  undefined1 local_88 [8];
  vector<long,_std::allocator<long>_> remain_pos;
  undefined1 local_68 [8];
  vector<long,_std::allocator<long>_> delete_pos;
  undefined1 local_48 [4];
  int i;
  vector<long,_std::allocator<long>_> pos;
  GGMTree *tree;
  uint8_t *key;
  
  this = (GGMTree *)operator_new(4);
  GGMTree::GGMTree(this,8);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_48);
  for (delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 8;
      delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<long,std::allocator<long>>::emplace_back<int&>
              ((vector<long,std::allocator<long>> *)local_48,
               (int *)((long)&delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_68);
  remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1;
  std::vector<long,_std::allocator<long>_>::emplace_back<int>
            ((vector<long,_std::allocator<long>_> *)local_68,
             (int *)((long)&remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_88);
  __first1 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)local_48);
  __last1 = std::vector<long,_std::allocator<long>_>::end
                      ((vector<long,_std::allocator<long>_> *)local_48);
  __first2 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)local_68);
  __last2 = std::vector<long,_std::allocator<long>_>::end
                      ((vector<long,_std::allocator<long>_> *)local_68);
  __i = std::vector<long,_std::allocator<long>_>::begin
                  ((vector<long,_std::allocator<long>_> *)local_88);
  iVar5 = std::inserter<std::vector<long,std::allocator<long>>>
                    ((vector<long,_std::allocator<long>_> *)local_88,__i);
  iVar5 = std::
          set_difference<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::insert_iterator<std::vector<long,std::allocator<long>>>>
                    ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                     __first1._M_current,
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                     __last1._M_current,
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                     __first2._M_current,
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                     __last2._M_current,iVar5);
  node_list.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)iVar5.container;
  std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1);
  __n = std::vector<long,_std::allocator<long>_>::size
                  ((vector<long,_std::allocator<long>_> *)local_88);
  std::vector<GGMNode,_std::allocator<GGMNode>_>::reserve
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1,__n);
  __end1 = std::vector<long,_std::allocator<long>_>::begin
                     ((vector<long,_std::allocator<long>_> *)local_88);
  pos_1 = (long)std::vector<long,_std::allocator<long>_>::end
                          ((vector<long,_std::allocator<long>_> *)local_88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&pos_1);
    if (!bVar1) break;
    plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end1);
    index = *plVar3;
    iVar2 = GGMTree::get_level(this);
    GGMNode::GGMNode((GGMNode *)
                     &remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,index,iVar2);
    std::vector<GGMNode,_std::allocator<GGMNode>_>::emplace_back<GGMNode>
              ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1,
               (GGMNode *)
               &remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&__end1);
  }
  std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1_1,
             (vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1);
  GGMTree::min_coverage
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_140,this,
             (vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1_1);
  std::vector<GGMNode,_std::allocator<GGMNode>_>::~vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1_1);
  __end1_1 = std::vector<GGMNode,_std::allocator<GGMNode>_>::begin
                       ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_140);
  i_1 = (GGMNode *)
        std::vector<GGMNode,_std::allocator<GGMNode>_>::end
                  ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_140);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>
                        *)&i_1);
    if (!bVar1) break;
    pGVar4 = __gnu_cxx::
             __normal_iterator<GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>::
             operator*(&__end1_1);
    builtin_memcpy(pGVar4->key,"0123456789123456",0x10);
    GGMTree::derive_key_from_tree(pGVar4->key,pGVar4->index,pGVar4->level,0);
    __gnu_cxx::__normal_iterator<GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>::
    operator++(&__end1_1);
  }
  std::
  unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
  ::clear(&keys);
  iVar2 = GGMTree::get_level(this);
  PPRF_compute_all_keys((vector<GGMNode,_std::allocator<GGMNode>_> *)local_140,iVar2);
  PPRF_Eval(1);
  PPRF_Eval(2);
  PPRF_Eval(0);
  std::vector<GGMNode,_std::allocator<GGMNode>_>::~vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_140);
  std::vector<GGMNode,_std::allocator<GGMNode>_>::~vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&__range1);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_88)
  ;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_68)
  ;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_48)
  ;
  return 0;
}

Assistant:

int main() {
    /*Setup  */
    uint8_t *key = (unsigned char*) "0123456789123456";
    GGMTree *tree;
    tree = new GGMTree(GGM_SIZE);

    /*Punc */
    vector<long> pos;
    for (int i = 0; i < GGM_SIZE; ++i) {
        pos.emplace_back(i);
    }
    vector<long> delete_pos ;
    delete_pos.emplace_back(1);

    vector<long> remain_pos;
    set_difference(pos.begin(), pos.end(),
                   delete_pos.begin(), delete_pos.end(),
                   inserter(remain_pos, remain_pos.begin()));

    vector<GGMNode> node_list;
    node_list.reserve(remain_pos.size()); //preallocate memory for vector
    for (long pos : remain_pos) {
        node_list.emplace_back(GGMNode(pos, tree->get_level()));
    }
    vector<GGMNode> remain_node = tree->min_coverage(node_list);

    for(auto & i : remain_node) {
        memcpy(i.key, key, AES_BLOCK_SIZE);
        GGMTree::derive_key_from_tree(i.key, i.index, i.level, 0);
    }
    /*Eval */
    keys.clear();

    PPRF_compute_all_keys(remain_node, tree->get_level());// precompute all keys of nodes

    PPRF_Eval(1);
    PPRF_Eval(2);
    PPRF_Eval(0);

    return 0;
}